

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_GetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  ushort uVar1;
  Var pvVar2;
  Var pvVar3;
  InlineCache *pIVar4;
  ScriptContext *requestContext;
  FunctionBody *functionBody;
  code *pcVar5;
  bool bVar6;
  PropertyId PVar7;
  undefined4 *puVar8;
  RecyclableObject *propertyObject;
  RecyclableObject *instance;
  uchar localRegisterID;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var value;
  
  pvVar2 = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,pvVar2,false,true);
  pvVar3 = *(Var *)(this + (ulong)playout->Value2 * 8 + 0x160);
  ValidateRegValue(this,pvVar3,false,true);
  uVar1 = playout->PropertyIdIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar6) goto LAB_00a58742;
    *puVar8 = 0;
  }
  if (*(uint *)(this + 200) <= (uint)uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar6) goto LAB_00a58742;
    *puVar8 = 0;
  }
  pIVar4 = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar1 * 8);
  PVar7 = FunctionBody::GetPropertyIdFromCacheId
                    (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  bVar6 = VarIs<Js::RecyclableObject>(pvVar2);
  if (bVar6) {
    bVar6 = VarIs<Js::RecyclableObject>(pvVar3);
    if (bVar6) {
      propertyObject = VarTo<Js::RecyclableObject>(pvVar2);
      instance = VarTo<Js::RecyclableObject>(pvVar3);
      local_90 = (undefined1  [8])0x0;
      info.m_instance = (RecyclableObject *)0x50000ffff;
      info.m_propertyIndex = 0;
      info.m_attributes = '\0';
      info.flags = InlineCacheNoFlags;
      info.cacheInfoFlag = 0;
      info.inlineCache = (InlineCache *)0x0;
      info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
      info.functionBody = (FunctionBody *)0x0;
      info.prop = (RecyclableObject *)0x0;
      info.propertyRecordUsageCache._0_4_ = 0xffffffff;
      info.propertyRecordUsageCache._5_1_ = 1;
      PropertyValueInfo::SetCacheInfo
                ((PropertyValueInfo *)local_90,*(FunctionBody **)(this + 0x88),pIVar4,
                 (uint)playout->PropertyIdIndex,true);
      requestContext = *(ScriptContext **)(this + 0x78);
      if (info._8_8_ == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                    ,0x21,
                                    "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())"
                                    ,
                                    "IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()"
                                   );
        if (!bVar6) goto LAB_00a58742;
        *puVar8 = 0;
      }
      if (info.inlineCache != (InlineCache *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                    ,0x22,
                                    "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                    ,
                                    "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                                   );
        if (!bVar6) goto LAB_00a58742;
        *puVar8 = 0;
      }
      bVar6 = InlineCache::TryGetProperty<true,false,false,false,false,false>
                        ((InlineCache *)info._8_8_,instance,propertyObject,PVar7,
                         (Var *)&info.inlineCacheIndex,requestContext,
                         (PropertyCacheOperationInfo *)0x0);
      if (bVar6) {
        localRegisterID = playout->Value;
        goto LAB_00a5872e;
      }
    }
  }
  localRegisterID = playout->Value;
  functionBody = *(FunctionBody **)(this + 0x88);
  uVar1 = playout->PropertyIdIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar6) goto LAB_00a58742;
    *puVar8 = 0;
  }
  if (*(uint *)(this + 200) <= (uint)uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar6) {
LAB_00a58742:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  pIVar4 = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar1 * 8);
  uVar1 = playout->PropertyIdIndex;
  pvVar2 = *(Var *)(this + (ulong)playout->Instance * 8 + 0x160);
  ValidateRegValue(this,pvVar2,false,true);
  PVar7 = FunctionBody::GetPropertyIdFromCacheId
                    (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  pvVar3 = *(Var *)(this + (ulong)playout->Value2 * 8 + 0x160);
  ValidateRegValue(this,pvVar3,false,true);
  info._56_8_ = JavascriptOperators::PatchGetValueWithThisPtr<false,Js::InlineCache>
                          (functionBody,pIVar4,(uint)uVar1,pvVar2,PVar7,pvVar3);
LAB_00a5872e:
  SetReg<unsigned_char>(this,localRegisterID,(Var)info._56_8_);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetSuperProperty(unaligned T* playout)
    {
        // Same fast path as in the backend.
        Var instance = GetReg(playout->Instance);
        Var thisInstance = GetReg(playout->Value2);
        InlineCache *inlineCache = GetInlineCache(playout->PropertyIdIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->PropertyIdIndex);
        if (VarIs<RecyclableObject>(instance) && VarIs<RecyclableObject>(thisInstance))
        {
            RecyclableObject* superObj = VarTo<RecyclableObject>(instance);
            RecyclableObject* thisObj = VarTo<RecyclableObject>(thisInstance);
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->PropertyIdIndex, true);

            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                thisObj, false, superObj, propertyId, &value, GetScriptContext(), nullptr, &info))
            {
                SetReg(playout->Value, value);
                return;
            }
        }
        SetReg(
            playout->Value,
            JavascriptOperators::PatchGetValueWithThisPtr<false>(
                GetFunctionBody(),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetReg(playout->Value2)));
    }